

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

Mat __thiscall Mat::Get(Mat *this,int min_m,int max_m,int min_n,int max_n)

{
  int iVar1;
  uint uVar2;
  double *pdVar3;
  long lVar4;
  undefined4 in_register_00000014;
  double *extraout_RDX;
  double *pdVar5;
  undefined4 in_register_00000034;
  int in_R9D;
  long lVar6;
  long lVar7;
  int iVar8;
  Mat MVar9;
  
  pdVar5 = (double *)CONCAT44(in_register_00000014,max_m);
  iVar1 = (min_n - max_m) + 1;
  iVar8 = (in_R9D - max_n) + 1;
  this->n_rows_ = iVar1;
  this->n_cols_ = iVar8;
  uVar2 = iVar1 * iVar8;
  if ((int)uVar2 < 1) {
    pdVar3 = (double *)0x0;
  }
  else {
    pdVar3 = (double *)operator_new__((ulong)uVar2 << 3);
    pdVar5 = extraout_RDX;
  }
  this->v_ = pdVar3;
  if (max_m <= min_n) {
    lVar4 = (long)*(int *)(CONCAT44(in_register_00000034,min_m) + 4);
    pdVar5 = (double *)(long)max_m;
    lVar7 = (long)max_n * 8 + lVar4 * (long)pdVar5 * 8 +
            *(long *)(CONCAT44(in_register_00000034,min_m) + 8);
    iVar1 = 0;
    do {
      if (max_n <= in_R9D) {
        lVar6 = 0;
        do {
          pdVar3[iVar1 + lVar6] = *(double *)(lVar7 + lVar6 * 8);
          lVar6 = lVar6 + 1;
        } while (iVar8 != (int)lVar6);
        iVar1 = iVar1 + (int)lVar6;
      }
      pdVar5 = (double *)((long)pdVar5 + 1);
      lVar7 = lVar7 + lVar4 * 8;
    } while (min_n + 1 != (int)pdVar5);
  }
  MVar9.v_ = pdVar5;
  MVar9._0_8_ = this;
  return MVar9;
}

Assistant:

Mat Mat::Get(const int min_m, const int max_m, const int min_n, const int max_n) const
{
	Mat getmat(max_m-min_m+1,max_n-min_n+1);
	int i, im , in;  
	for(i = 0 , im=min_m; im<max_m+1;  ++im)
		for(in=min_n; in<max_n+1; ++i, ++in)		
			getmat.v_[i]=v_[im*n_cols_+in];
	return getmat;
}